

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_permissions.cpp
# Opt level: O1

bool anon_unknown.dwarf_2badbf3::TryParsePermissionFlags
               (string *str,NetPermissionFlags *output,
               ConnectionDirection *output_connection_direction,size_t *readen,bilingual_str *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer __s;
  _Alloc_hider _Var3;
  int iVar4;
  NetPermissionFlags NVar5;
  ConnectionDirection CVar6;
  ConnectionDirection CVar7;
  void *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar9;
  ulong __pos;
  size_type __size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  long in_FS_OFFSET;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> permission;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> permissions;
  long *local_118;
  long local_110;
  long local_108 [2];
  bilingual_str local_f8;
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_38;
  size_type sVar10;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (str->_M_string_length == 0) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
  }
  else {
    __s = (str->_M_dataplus)._M_p;
    pvVar8 = memchr(__s,0x40,str->_M_string_length);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (-(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)__s);
  }
  *readen = 0;
  if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              0xffffffffffffffff) {
    CVar6 = None;
    NVar5 = Implicit;
LAB_006cbd6d:
    CVar7 = In;
    if ((CVar6 == None) || (CVar7 = CVar6, NVar5 != None)) {
      *output = NVar5;
      if (output_connection_direction != (ConnectionDirection *)0x0) {
        *output_connection_direction = CVar7;
      }
      local_118 = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
      paVar1 = &local_b8.original.field_2;
      local_b8.original._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_118,local_110 + (long)local_118);
      paVar2 = &local_b8.translated.field_2;
      local_b8.translated._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8.translated,local_118,local_110 + (long)local_118);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_b8.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_b8.translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.translated._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8.translated._M_dataplus._M_p,
                        local_b8.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.original._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8.original._M_dataplus._M_p,
                        local_b8.original.field_2._M_allocated_capacity + 1);
      }
      if (local_118 != local_108) {
        operator_delete(local_118,local_108[0] + 1);
      }
      bVar11 = true;
      goto LAB_006cbd38;
    }
    paVar1 = &local_f8.original.field_2;
    local_f8.original._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Only direction was set, no permissions: \'%s\'","");
    paVar2 = &local_f8.translated.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_f8.translated._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8.translated,"Only direction was set, no permissions: \'%s\'","")
      ;
    }
    else {
      local_78.translated._M_dataplus._M_p = "Only direction was set, no permissions: \'%s\'";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_f8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                 (char **)&local_78.translated);
    }
    tinyformat::format<std::__cxx11::string>
              (&local_b8,(tinyformat *)&local_f8,(bilingual_str *)str,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_b8.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_b8.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.translated._M_dataplus._M_p != &local_b8.translated.field_2) {
      operator_delete(local_b8.translated._M_dataplus._M_p,
                      local_b8.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.original._M_dataplus._M_p != &local_b8.original.field_2) {
      operator_delete(local_b8.original._M_dataplus._M_p,
                      local_b8.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8.translated._M_dataplus._M_p,
                      local_f8.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8.original._M_dataplus._M_p,
                      local_f8.original.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78.translated,str,0,(size_type)args);
    __pos = *readen;
    bVar11 = __pos < local_78.translated._M_string_length;
    if (bVar11) {
      NVar5 = None;
      CVar6 = None;
      do {
        sVar10 = local_78.translated._M_string_length;
        _Var3._M_p = local_78.translated._M_dataplus._M_p;
        pvVar8 = memchr(local_78.translated._M_dataplus._M_p + __pos,0x2c,
                        local_78.translated._M_string_length - __pos);
        uVar9 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)_Var3._M_p;
        if (uVar9 != 0xffffffffffffffff) {
          sVar10 = uVar9;
        }
        __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar10 - __pos);
        args = __n;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78.original,&local_78.translated,__pos,(size_type)__n);
        *readen = (long)&(__n->_M_dataplus)._M_p + *readen + (ulong)(uVar9 != 0xffffffffffffffff);
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_78.original,"bloomfilter");
        if ((iVar4 == 0) ||
           (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_78.original,"bloom"), iVar4 == 0)) {
          NVar5 = NVar5 | BloomFilter;
        }
        else {
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_78.original,"noban");
          if (iVar4 == 0) {
            NVar5 = NVar5 | NoBan;
          }
          else {
            iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_78.original,"forcerelay");
            if (iVar4 == 0) {
              NVar5 = NVar5 | ForceRelay;
            }
            else {
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_78.original,"mempool");
              if (iVar4 == 0) {
                NVar5 = NVar5 | Mempool;
              }
              else {
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_78.original,"download");
                if (iVar4 == 0) {
                  NVar5 = NVar5 | Download;
                }
                else {
                  iVar4 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_78.original,"all");
                  if (iVar4 == 0) {
                    NVar5 = All;
                  }
                  else {
                    iVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_78.original,"relay");
                    if (iVar4 == 0) {
                      NVar5 = NVar5 | Relay;
                    }
                    else {
                      iVar4 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(&local_78.original,"addr");
                      if (iVar4 == 0) {
                        NVar5 = NVar5 | Addr;
                      }
                      else {
                        iVar4 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_78.original,"in");
                        if (iVar4 == 0) {
                          CVar6 = CVar6 | In;
                        }
                        else {
                          iVar4 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare(&local_78.original,"out");
                          if (iVar4 == 0) {
                            if (output_connection_direction == (ConnectionDirection *)0x0) {
                              _(&local_b8,(ConstevalStringLiteral)0x89fb54);
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              operator=(&error->original,&local_b8.original);
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              operator=(&error->translated,&local_b8.translated);
                              bilingual_str::~bilingual_str(&local_b8);
                              goto LAB_006cc06a;
                            }
                            CVar6 = CVar6 | Out;
                          }
                          else if (local_78.original._M_string_length != 0) {
                            _(&local_f8,(ConstevalStringLiteral)0x89fb9b);
                            tinyformat::format<std::__cxx11::string>
                                      (&local_b8,(tinyformat *)&local_f8,&local_78,args);
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            operator=(&error->original,&local_b8.original);
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            operator=(&error->translated,&local_b8.translated);
                            bilingual_str::~bilingual_str(&local_b8);
                            bilingual_str::~bilingual_str(&local_f8);
LAB_006cc06a:
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_78.original._M_dataplus._M_p != &local_78.original.field_2)
                            {
                              operator_delete(local_78.original._M_dataplus._M_p,
                                              local_78.original.field_2._M_allocated_capacity + 1);
                            }
                            goto LAB_006cbd10;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
          operator_delete(local_78.original._M_dataplus._M_p,
                          local_78.original.field_2._M_allocated_capacity + 1);
        }
        __pos = *readen;
        bVar11 = __pos < local_78.translated._M_string_length;
      } while (bVar11);
    }
    else {
      CVar6 = None;
      NVar5 = None;
    }
    *readen = __pos + 1;
LAB_006cbd10:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
    }
    if (!bVar11) goto LAB_006cbd6d;
  }
  bVar11 = false;
LAB_006cbd38:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

static bool TryParsePermissionFlags(const std::string& str, NetPermissionFlags& output, ConnectionDirection* output_connection_direction, size_t& readen, bilingual_str& error)
{
    NetPermissionFlags flags = NetPermissionFlags::None;
    ConnectionDirection connection_direction = ConnectionDirection::None;
    const auto atSeparator = str.find('@');

    // if '@' is not found (ie, "xxxxx"), the caller should apply implicit permissions
    if (atSeparator == std::string::npos) {
        NetPermissions::AddFlag(flags, NetPermissionFlags::Implicit);
        readen = 0;
    }
    // else (ie, "perm1,perm2@xxxxx"), let's enumerate the permissions by splitting by ',' and calculate the flags
    else {
        readen = 0;
        // permissions == perm1,perm2
        const auto permissions = str.substr(0, atSeparator);
        while (readen < permissions.length()) {
            const auto commaSeparator = permissions.find(',', readen);
            const auto len = commaSeparator == std::string::npos ? permissions.length() - readen : commaSeparator - readen;
            // permission == perm1
            const auto permission = permissions.substr(readen, len);
            readen += len; // We read "perm1"
            if (commaSeparator != std::string::npos) readen++; // We read ","

            if (permission == "bloomfilter" || permission == "bloom") NetPermissions::AddFlag(flags, NetPermissionFlags::BloomFilter);
            else if (permission == "noban") NetPermissions::AddFlag(flags, NetPermissionFlags::NoBan);
            else if (permission == "forcerelay") NetPermissions::AddFlag(flags, NetPermissionFlags::ForceRelay);
            else if (permission == "mempool") NetPermissions::AddFlag(flags, NetPermissionFlags::Mempool);
            else if (permission == "download") NetPermissions::AddFlag(flags, NetPermissionFlags::Download);
            else if (permission == "all") NetPermissions::AddFlag(flags, NetPermissionFlags::All);
            else if (permission == "relay") NetPermissions::AddFlag(flags, NetPermissionFlags::Relay);
            else if (permission == "addr") NetPermissions::AddFlag(flags, NetPermissionFlags::Addr);
            else if (permission == "in") connection_direction |= ConnectionDirection::In;
            else if (permission == "out") {
                if (output_connection_direction == nullptr) {
                    // Only NetWhitebindPermissions() should pass a nullptr.
                    error = _("whitebind may only be used for incoming connections (\"out\" was passed)");
                    return false;
                }
                connection_direction |= ConnectionDirection::Out;
            }
            else if (permission.length() == 0); // Allow empty entries
            else {
                error = strprintf(_("Invalid P2P permission: '%s'"), permission);
                return false;
            }
        }
        readen++;
    }

    // By default, whitelist only applies to incoming connections
    if (connection_direction == ConnectionDirection::None) {
        connection_direction = ConnectionDirection::In;
    } else if (flags == NetPermissionFlags::None) {
        error = strprintf(_("Only direction was set, no permissions: '%s'"), str);
        return false;
    }

    output = flags;
    if (output_connection_direction) *output_connection_direction = connection_direction;
    error = Untranslated("");
    return true;
}